

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<unsigned_int,int,float>
                (ImGuiDataType data_type,uint v,uint v_min,uint v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  byte in_R8B;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  float in_XMM1_Da;
  undefined1 auVar7 [16];
  undefined1 in_ZMM2 [64];
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  float v_max_fudged;
  float v_min_fudged;
  bool flipped;
  uint v_clamped;
  float local_6c;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  uint local_44;
  float local_34;
  float local_30;
  float local_2c;
  uint local_14;
  uint local_10;
  uint local_c;
  
  auVar7 = in_ZMM2._0_16_;
  auVar6 = in_ZMM0._0_16_;
  fVar4 = in_ZMM0._0_4_;
  if (in_EDX == in_ECX) {
    return 0.0;
  }
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (in_EDX < in_ECX) {
    local_44 = ImClamp<unsigned_int>(in_ESI,in_EDX,in_ECX);
  }
  else {
    local_44 = ImClamp<unsigned_int>(in_ESI,in_ECX,in_EDX);
  }
  if ((in_R8B & 1) == 0) {
    return (float)(int)(local_44 - local_10) / (float)(int)(local_14 - local_10);
  }
  bVar2 = local_14 < local_10;
  if (bVar2) {
    ImSwap<unsigned_int>(&local_10,&local_14);
  }
  auVar6 = vcvtusi2ss_avx512f(auVar6,local_10);
  fVar3 = ImAbs(auVar6._0_4_);
  if (fVar4 <= fVar3) {
    auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar4),local_10);
    local_4c = auVar6._0_4_;
  }
  else {
    auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar4),local_10);
    local_48 = fVar4;
    if (auVar6._0_4_ < 0.0) {
      local_48 = -fVar4;
    }
    local_4c = local_48;
  }
  local_2c = local_4c;
  auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)local_4c),local_14);
  fVar3 = ImAbs(auVar6._0_4_);
  if (fVar4 <= fVar3) {
    auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar4),local_14);
    local_54 = auVar6._0_4_;
  }
  else {
    auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar4),local_14);
    local_50 = fVar4;
    if (auVar6._0_4_ < 0.0) {
      local_50 = -fVar4;
    }
    local_54 = local_50;
  }
  local_30 = local_54;
  auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)local_54),local_10);
  if ((auVar6._0_4_ == 0.0) && (!NAN(auVar6._0_4_))) {
    auVar1 = vcvtusi2ss_avx512f(auVar6,local_14);
    auVar6 = (undefined1  [16])0x0;
    if (auVar1._0_4_ < 0.0) {
      local_2c = -fVar4;
      auVar6 = ZEXT416((uint)local_2c);
      goto LAB_005d4f60;
    }
  }
  auVar6 = vcvtusi2ss_avx512f(auVar6,local_14);
  if ((auVar6._0_4_ == 0.0) && (!NAN(auVar6._0_4_))) {
    auVar1 = vcvtusi2ss_avx512f(auVar6,local_10);
    auVar6 = (undefined1  [16])0x0;
    if (auVar1._0_4_ < 0.0) {
      local_30 = -fVar4;
      auVar6 = ZEXT416((uint)local_30);
    }
  }
LAB_005d4f60:
  auVar6 = vcvtusi2ss_avx512f(auVar6,local_44);
  if (local_2c < auVar6._0_4_) {
    auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)local_2c),local_44);
    if (auVar6._0_4_ < local_30) {
      auVar6 = vcvtusi2ss_avx512f(auVar6,local_10 * local_14);
      if (0.0 <= auVar6._0_4_) {
        auVar6 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_10);
        if ((auVar6._0_4_ < 0.0) ||
           (auVar6 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_14), auVar6._0_4_ < 0.0)) {
          vcvtusi2ss_avx512f((undefined1  [16])0x0,local_44);
          fVar4 = ImLog(0.0);
          fVar3 = ImLog(0.0);
          local_34 = 1.0 - fVar4 / fVar3;
        }
        else {
          vcvtusi2ss_avx512f((undefined1  [16])0x0,local_44);
          local_34 = ImLog(0.0);
          fVar4 = ImLog(0.0);
          local_34 = local_34 / fVar4;
        }
      }
      else {
        auVar1 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_10);
        auVar6 = vcvtusi2ss_avx512f(auVar6,local_14);
        auVar7 = vcvtusi2ss_avx512f(auVar7,local_10);
        local_34 = -auVar1._0_4_ / (auVar6._0_4_ - auVar7._0_4_);
        fVar4 = local_34 + in_XMM1_Da;
        auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar4),local_c);
        if ((auVar6._0_4_ != 0.0) || (NAN(auVar6._0_4_))) {
          auVar6 = vcvtusi2ss_avx512f(auVar6,local_c);
          if (0.0 <= auVar6._0_4_) {
            vcvtusi2ss_avx512f(ZEXT416((uint)fVar4),local_44);
            fVar3 = ImLog(0.0);
            fVar5 = ImLog(0.0);
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar4)),ZEXT416((uint)(fVar3 / fVar5)),
                                     ZEXT416((uint)fVar4));
            local_34 = auVar6._0_4_;
          }
          else {
            vcvtusi2ss_avx512f((undefined1  [16])0x0,local_44);
            fVar4 = ImLog(0.0);
            fVar3 = ImLog(0.0);
            local_34 = (1.0 - fVar4 / fVar3) * (local_34 - in_XMM1_Da);
          }
        }
      }
    }
    else {
      local_34 = 1.0;
    }
  }
  else {
    local_34 = 0.0;
  }
  if (bVar2) {
    local_6c = 1.0 - local_34;
  }
  else {
    local_6c = local_34;
  }
  return local_6c;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}